

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

void __thiscall FNodeBuilder::AddPolySegs(FNodeBuilder *this,FPolySeg *segs,int numsegs)

{
  double *pdVar1;
  DWORD DVar2;
  DWORD DVar3;
  uint uVar4;
  long *plVar5;
  sector_t_conflict *psVar6;
  long lVar7;
  FPrivVert *pFVar8;
  line_t_conflict *plVar9;
  side_t *psVar10;
  FPrivSeg *pFVar11;
  FPrivSeg *pFVar12;
  int iVar13;
  int iVar14;
  sector_t_conflict *psVar15;
  long lVar16;
  undefined8 local_40 [2];
  
  if (numsegs < 1) {
    __assert_fail("numsegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild_utility.cpp"
                  ,0xf4,"void FNodeBuilder::AddPolySegs(FPolySeg *, int)");
  }
  lVar16 = 0;
  do {
    plVar5 = *(long **)((long)&segs->wall + lVar16);
    if (plVar5 == (long *)0x0) {
      __assert_fail("side != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild_utility.cpp"
                    ,0x105,"void FNodeBuilder::AddPolySegs(FPolySeg *, int)");
    }
    psVar6 = (sector_t_conflict *)*plVar5;
    psVar15 = *(sector_t_conflict **)(plVar5[0x14] + 0x78);
    if (psVar15 == psVar6) {
      psVar15 = *(sector_t_conflict **)(plVar5[0x14] + 0x80);
    }
    pdVar1 = (double *)((long)&(segs->v1).pos.X + lVar16);
    local_40[0] = CONCAT44(SUB84(pdVar1[1] + 103079215104.0,0),SUB84(*pdVar1 + 103079215104.0,0));
    iVar13 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40);
    pdVar1 = (double *)((long)&(segs->v2).pos.X + lVar16);
    local_40[0] = CONCAT44(SUB84(pdVar1[1] + 103079215104.0,0),SUB84(*pdVar1 + 103079215104.0,0));
    iVar14 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,local_40);
    lVar7 = plVar5[0x14];
    pFVar8 = (this->Vertices).Array;
    plVar9 = this->Level->Lines;
    psVar10 = this->Level->Sides;
    DVar2 = pFVar8[iVar13].segs;
    DVar3 = pFVar8[iVar14].segs2;
    TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Grow(&this->Segs,1);
    pFVar11 = (this->Segs).Array;
    uVar4 = (this->Segs).Count;
    pFVar11[uVar4].v1 = iVar13;
    pFVar11[uVar4].v2 = iVar14;
    pFVar11[uVar4].sidedef = (int)((ulong)((long)plVar5 - (long)psVar10) >> 6) * -0x55555555;
    pFVar11[uVar4].linedef = (int)((ulong)(lVar7 - (long)plVar9) >> 3) * 0x286bca1b;
    pFVar11[uVar4].frontsector = psVar6;
    pFVar11[uVar4].backsector = psVar15;
    pFVar11[uVar4].next = 0xffffffff;
    pFVar11[uVar4].nextforvert = DVar2;
    pFVar11[uVar4].nextforvert2 = DVar3;
    pFVar12 = pFVar11 + uVar4;
    pFVar12->loopnum = 0;
    pFVar12->partner = 0xffffffff;
    *(undefined8 *)(&pFVar12->loopnum + 2) = 0xffffffffffffffff;
    pFVar11[uVar4].planefront = false;
    pFVar11[uVar4].hashnext = (FPrivSeg *)0x0;
    uVar4 = (this->Segs).Count;
    (this->Segs).Count = uVar4 + 1;
    pFVar8 = (this->Vertices).Array;
    pFVar8[iVar13].segs = uVar4;
    pFVar8[iVar14].segs2 = uVar4;
    lVar16 = lVar16 + 0x28;
  } while ((ulong)(uint)numsegs * 0x28 != lVar16);
  return;
}

Assistant:

void FNodeBuilder::AddPolySegs(FPolySeg *segs, int numsegs)
{
	assert(numsegs > 0);

	for (int i = 0; i < numsegs; ++i)
	{
		FPrivSeg seg;
		FPrivVert vert;
		int segnum;

		seg.next = DWORD_MAX;
		seg.loopnum = 0;
		seg.partner = DWORD_MAX;
		seg.hashnext = NULL;
		seg.planefront = false;
		seg.planenum = DWORD_MAX;
		seg.storedseg = DWORD_MAX;

		side_t *side = segs[i].wall;
		assert(side != NULL);

		seg.frontsector = side->sector;
		seg.backsector = side->linedef->frontsector == side->sector ? side->linedef->backsector : side->linedef->frontsector;
		vert.x = FLOAT2FIXED(segs[i].v1.pos.X);
		vert.y = FLOAT2FIXED(segs[i].v1.pos.Y);
		seg.v1 = VertexMap->SelectVertexExact(vert);
		vert.x = FLOAT2FIXED(segs[i].v2.pos.X);
		vert.y = FLOAT2FIXED(segs[i].v2.pos.Y);
		seg.v2 = VertexMap->SelectVertexExact(vert);
		seg.linedef = int(side->linedef - Level.Lines);
		seg.sidedef = int(side - Level.Sides);
		seg.nextforvert = Vertices[seg.v1].segs;
		seg.nextforvert2 = Vertices[seg.v2].segs2;

		segnum = (int)Segs.Push(seg);
		Vertices[seg.v1].segs = segnum;
		Vertices[seg.v2].segs2 = segnum;
	}
}